

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

void __thiscall
nonsugar::detail::parse_flag_short<std::__cxx11::string,void,void>::operator()
          (parse_flag_short<std::__cxx11::string,void,void> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *param_1,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   param_2,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *param_3,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   param_4,shared_ptr<void> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__V_,_void>
          *param_6,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_7)

{
  shared_ptr<int> local_48;
  shared_ptr<void> *local_38;
  shared_ptr<void> *value_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *param_3_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *param_1_local;
  parse_flag_short<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_void>
  *this_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  param_4_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  param_2_local;
  
  local_38 = value;
  value_local = (shared_ptr<void> *)param_3;
  param_3_local =
       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)param_1;
  param_1_local =
       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)this;
  this_local = (parse_flag_short<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_void>
                *)param_4._M_current;
  param_4_local._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2._M_current;
  std::make_shared<int>();
  std::shared_ptr<void>::operator=(local_38,&local_48);
  std::shared_ptr<int>::~shared_ptr(&local_48);
  return;
}

Assistant:

void operator()(
        NameIterator &, NameIterator, Iterator &, Iterator,
        std::shared_ptr<void> &value, Flag const &, String &) const
    {
        value = std::make_shared<int>();
    }